

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O1

void __thiscall DetectorSS::~DetectorSS(DetectorSS *this)

{
  unsigned_long *puVar1;
  key_tp *pkVar2;
  int *piVar3;
  uchar *puVar4;
  uchar **ppuVar5;
  key_tp **ppkVar6;
  int **ppiVar7;
  pointer ppVar8;
  long lVar9;
  
  puVar1 = (this->ss_).hash;
  if (puVar1 != (unsigned_long *)0x0) {
    operator_delete__(puVar1);
  }
  if (0 < (this->ss_).depth) {
    lVar9 = 0;
    do {
      pkVar2 = (this->ss_).skey[lVar9];
      if (pkVar2 != (key_tp *)0x0) {
        operator_delete__(pkVar2);
      }
      piVar3 = (this->ss_).level[lVar9];
      if (piVar3 != (int *)0x0) {
        operator_delete__(piVar3);
      }
      puVar4 = (this->ss_).counts[lVar9];
      if (puVar4 != (uchar *)0x0) {
        operator_delete__(puVar4);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->ss_).depth);
  }
  piVar3 = (this->ss_).offsets;
  if (piVar3 != (int *)0x0) {
    operator_delete__(piVar3);
  }
  ppuVar5 = (this->ss_).counts;
  if (ppuVar5 != (uchar **)0x0) {
    operator_delete__(ppuVar5);
  }
  ppkVar6 = (this->ss_).skey;
  if (ppkVar6 != (key_tp **)0x0) {
    operator_delete__(ppkVar6);
  }
  ppiVar7 = (this->ss_).level;
  if (ppiVar7 != (int **)0x0) {
    operator_delete__(ppiVar7);
  }
  ppVar8 = (this->heap_).
           super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar8 != (pointer)0x0) {
    operator_delete(ppVar8,(long)(this->heap_).
                                 super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar8);
    return;
  }
  return;
}

Assistant:

DetectorSS::~DetectorSS() {
	delete[] ss_.hash;
	for (int i = 0; i < ss_.depth; i++) {
		delete[] ss_.skey[i];
		delete[] ss_.level[i];
		delete[] ss_.counts[i];
	}
	delete[] ss_.offsets;
	delete[] ss_.counts;
	delete[] ss_.skey;
	delete[] ss_.level;
#ifdef HH
	delete[] ss_.key;
	delete[] ss_.indicator;
#endif
}